

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publickey.c
# Opt level: O3

int libssh2_publickey_shutdown(LIBSSH2_PUBLICKEY *pkey)

{
  LIBSSH2_SESSION *pLVar1;
  int iVar2;
  int iVar3;
  
  if (pkey != (LIBSSH2_PUBLICKEY *)0x0) {
    pLVar1 = pkey->channel->session;
    if (pkey->receive_packet != (uchar *)0x0) {
      (*pLVar1->free)(pkey->receive_packet,&pLVar1->abstract);
      pkey->receive_packet = (uchar *)0x0;
    }
    if (pkey->add_packet != (uchar *)0x0) {
      (*pLVar1->free)(pkey->add_packet,&pLVar1->abstract);
      pkey->add_packet = (uchar *)0x0;
    }
    if (pkey->remove_packet != (uchar *)0x0) {
      (*pLVar1->free)(pkey->remove_packet,&pLVar1->abstract);
      pkey->remove_packet = (uchar *)0x0;
    }
    if (pkey->listFetch_data != (uchar *)0x0) {
      (*pLVar1->free)(pkey->listFetch_data,&pLVar1->abstract);
      pkey->listFetch_data = (uchar *)0x0;
    }
    iVar2 = _libssh2_channel_free(pkey->channel);
    iVar3 = -0x25;
    if (iVar2 != -0x25) {
      (*pLVar1->free)(pkey,&pLVar1->abstract);
      iVar3 = 0;
    }
    return iVar3;
  }
  return -0x27;
}

Assistant:

LIBSSH2_API int
libssh2_publickey_shutdown(LIBSSH2_PUBLICKEY *pkey)
{
    LIBSSH2_SESSION *session;
    int rc;

    if(!pkey)
        return LIBSSH2_ERROR_BAD_USE;

    session = pkey->channel->session;

    /*
     * Make sure all memory used in the state variables are free
     */
    if(pkey->receive_packet) {
        LIBSSH2_FREE(session, pkey->receive_packet);
        pkey->receive_packet = NULL;
    }
    if(pkey->add_packet) {
        LIBSSH2_FREE(session, pkey->add_packet);
        pkey->add_packet = NULL;
    }
    if(pkey->remove_packet) {
        LIBSSH2_FREE(session, pkey->remove_packet);
        pkey->remove_packet = NULL;
    }
    if(pkey->listFetch_data) {
        LIBSSH2_FREE(session, pkey->listFetch_data);
        pkey->listFetch_data = NULL;
    }

    rc = _libssh2_channel_free(pkey->channel);
    if(rc == LIBSSH2_ERROR_EAGAIN)
        return rc;

    LIBSSH2_FREE(session, pkey);
    return 0;
}